

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

void __thiscall
Catch::CompactReporter::assertionEnded(CompactReporter *this,AssertionStats *_assertionStats)

{
  OfType OVar1;
  AssertionPrinter *this_00;
  ColourImpl *pCVar2;
  StringRef passOrFail;
  int iVar3;
  size_type sVar4;
  Code CVar5;
  char *pcVar6;
  size_type in_R9;
  StringRef passOrFail_00;
  StringRef passOrFail_01;
  StringRef passOrFail_02;
  StringRef passOrFail_03;
  StringRef passOrFail_04;
  StringRef passOrFail_05;
  StringRef passOrFail_06;
  StringRef passOrFail_07;
  StringRef lhs;
  StringRef rhs;
  AssertionPrinter printer;
  char local_71;
  AssertionPrinter local_70;
  string local_40;
  
  iVar3 = (*((this->super_StreamingReporterBase).super_ReporterBase.super_IEventListener.m_config)->
            _vptr_IConfig[4])();
  local_70.printInfoMessages = true;
  if ((((char)iVar3 == '\0') &&
      (((OVar1 = (_assertionStats->assertionResult).m_resultData.resultType,
        (OVar1 & FailureBit) == Ok ||
        (((_assertionStats->assertionResult).m_info.resultDisposition & SuppressFail) != 0)) &&
       (local_70.printInfoMessages = false, OVar1 != ExplicitSkip)))) && (OVar1 != Warning)) {
    return;
  }
  this_00 = (AssertionPrinter *)(this->super_StreamingReporterBase).super_ReporterBase.m_stream;
  pCVar2 = (this->super_StreamingReporterBase).super_ReporterBase.m_colour.m_ptr;
  local_70.messages = &_assertionStats->infoMessages;
  local_70.itMessage._M_current =
       (_assertionStats->infoMessages).
       super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_70.stream = (ostream *)this_00;
  local_70.result = &_assertionStats->assertionResult;
  local_70.colourImpl = pCVar2;
  (*pCVar2->_vptr_ColourImpl[2])(pCVar2,0x17);
  pcVar6 = (_assertionStats->assertionResult).m_info.lineInfo.file;
  local_40._M_string_length = (_assertionStats->assertionResult).m_info.lineInfo.line;
  local_40._M_dataplus._M_p._0_1_ = SUB81(pcVar6,0);
  local_40._M_dataplus._M_p._1_7_ = (undefined7)((ulong)pcVar6 >> 8);
  operator<<((ostream *)this_00,(SourceLineInfo *)&local_40);
  local_71 = ':';
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,&local_71,1);
  (*pCVar2->_vptr_ColourImpl[2])(pCVar2);
  local_70.itMessage._M_current =
       (_assertionStats->infoMessages).
       super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
       super__Vector_impl_data._M_start;
  OVar1 = (_assertionStats->assertionResult).m_resultData.resultType;
  if (0x10f < OVar1) {
    if (OVar1 < DidntThrowException) {
      if (OVar1 == Exception) goto switchD_00151960_caseD_ffffffff;
      if (OVar1 != ThrewException) goto switchD_00151960_caseD_3;
      passOrFail_01.m_size = 6;
      passOrFail_01.m_start = "failed";
      anon_unknown_26::AssertionPrinter::printResultType(&local_70,BrightRed,passOrFail_01);
      pcVar6 = "unexpected exception with message:";
LAB_00151a40:
      anon_unknown_26::AssertionPrinter::printIssue(this_00,pcVar6);
      anon_unknown_26::AssertionPrinter::printMessage(&local_70);
    }
    else {
      if (OVar1 != DidntThrowException) {
        if (OVar1 != FatalErrorCondition) goto switchD_00151960_caseD_3;
        passOrFail_03.m_size = 6;
        passOrFail_03.m_start = "failed";
        anon_unknown_26::AssertionPrinter::printResultType(&local_70,BrightRed,passOrFail_03);
        pcVar6 = "fatal error condition with message:";
        goto LAB_00151a40;
      }
      passOrFail_07.m_size = 6;
      passOrFail_07.m_start = "failed";
      anon_unknown_26::AssertionPrinter::printResultType(&local_70,BrightRed,passOrFail_07);
      anon_unknown_26::AssertionPrinter::printIssue(this_00,"expected exception, got none");
    }
    anon_unknown_26::AssertionPrinter::printExpressionWas(&local_70);
    goto LAB_00151bb4;
  }
  switch(OVar1) {
  case Ok:
    passOrFail_00.m_size = 6;
    passOrFail_00.m_start = "passed";
    anon_unknown_26::AssertionPrinter::printResultType(&local_70,BrightGreen,passOrFail_00);
    anon_unknown_26::AssertionPrinter::printOriginalExpression(&local_70);
    anon_unknown_26::AssertionPrinter::printReconstructedExpression(&local_70);
    if ((_assertionStats->assertionResult).m_info.capturedExpression.m_size != 0) goto LAB_00151bb4;
    break;
  case Info:
    pcVar6 = "info";
    sVar4 = 4;
    goto LAB_00151ad9;
  case Warning:
    pcVar6 = "warning";
    sVar4 = 7;
LAB_00151ad9:
    CVar5 = None;
LAB_00151af9:
    passOrFail_06.m_size = sVar4;
    passOrFail_06.m_start = pcVar6;
    anon_unknown_26::AssertionPrinter::printResultType(&local_70,CVar5,passOrFail_06);
    anon_unknown_26::AssertionPrinter::printMessage(&local_70);
LAB_00151bb4:
    CVar5 = FileName;
    goto LAB_00151bb9;
  default:
    goto switchD_00151960_caseD_3;
  case ExplicitSkip:
    pcVar6 = "skipped";
    sVar4 = 7;
    CVar5 = FileName;
    goto LAB_00151af9;
  case ExpressionFailed:
    if (((_assertionStats->assertionResult).m_info.resultDisposition & SuppressFail) == 0) {
      passOrFail_05.m_size = 6;
      passOrFail_05.m_start = "failed";
      anon_unknown_26::AssertionPrinter::printResultType(&local_70,BrightRed,passOrFail_05);
    }
    else {
      lhs.m_size = (size_type)" - but was ok";
      lhs.m_start = (char *)0x6;
      rhs.m_size = in_R9;
      rhs.m_start = (char *)0xd;
      operator+[abi_cxx11_(&local_40,(Catch *)0x180ec8,lhs,rhs);
      passOrFail.m_start._1_7_ = local_40._M_dataplus._M_p._1_7_;
      passOrFail.m_start._0_1_ = local_40._M_dataplus._M_p._0_1_;
      passOrFail.m_size = local_40._M_string_length;
      anon_unknown_26::AssertionPrinter::printResultType(&local_70,BrightGreen,passOrFail);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_40._M_dataplus._M_p._1_7_,local_40._M_dataplus._M_p._0_1_) !=
          &local_40.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_40._M_dataplus._M_p._1_7_,local_40._M_dataplus._M_p._0_1_),
                        local_40.field_2._M_allocated_capacity + 1);
      }
    }
    anon_unknown_26::AssertionPrinter::printOriginalExpression(&local_70);
    anon_unknown_26::AssertionPrinter::printReconstructedExpression(&local_70);
    goto LAB_00151bb4;
  case ExplicitFailure:
    passOrFail_04.m_size = 6;
    passOrFail_04.m_start = "failed";
    anon_unknown_26::AssertionPrinter::printResultType(&local_70,BrightRed,passOrFail_04);
    anon_unknown_26::AssertionPrinter::printIssue(this_00,"explicitly");
    break;
  case Unknown:
  case FailureBit:
switchD_00151960_caseD_ffffffff:
    passOrFail_02.m_size = 0x14;
    passOrFail_02.m_start = "** internal error **";
    anon_unknown_26::AssertionPrinter::printResultType(&local_70,BrightRed,passOrFail_02);
    goto switchD_00151960_caseD_3;
  }
  CVar5 = None;
LAB_00151bb9:
  anon_unknown_26::AssertionPrinter::printRemainingMessages(&local_70,CVar5);
switchD_00151960_caseD_3:
  local_40._M_dataplus._M_p._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>
            ((this->super_StreamingReporterBase).super_ReporterBase.m_stream,(char *)&local_40,1);
  std::ostream::flush();
  return;
}

Assistant:

void CompactReporter::assertionEnded( AssertionStats const& _assertionStats ) {
            AssertionResult const& result = _assertionStats.assertionResult;

            bool printInfoMessages = true;

            // Drop out if result was successful and we're not printing those
            if( !m_config->includeSuccessfulResults() && result.isOk() ) {
                if( result.getResultType() != ResultWas::Warning && result.getResultType() != ResultWas::ExplicitSkip )
                    return;
                printInfoMessages = false;
            }

            AssertionPrinter printer( m_stream, _assertionStats, printInfoMessages, m_colour.get() );
            printer.print();

            m_stream << '\n' << std::flush;
        }